

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddTriangleFilled(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImU32 col)

{
  int iVar1;
  ImVec2 *pIVar2;
  ImVec2 *__dest;
  int iVar3;
  ImVec2 *pIVar4;
  int iVar5;
  
  if (0xffffff < col) {
    iVar1 = (this->_Path).Size;
    if (iVar1 == (this->_Path).Capacity) {
      if (iVar1 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar1 / 2 + iVar1;
      }
      iVar5 = iVar1 + 1;
      if (iVar1 + 1 < iVar3) {
        iVar5 = iVar3;
      }
      pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 == (ImVec2 *)0x0) {
        pIVar4 = (ImVec2 *)0x0;
      }
      else {
        memcpy(pIVar2,pIVar4,(long)(this->_Path).Size << 3);
        pIVar4 = (this->_Path).Data;
      }
      ImGui::MemFree(pIVar4);
      (this->_Path).Data = pIVar2;
      (this->_Path).Capacity = iVar5;
      iVar1 = (this->_Path).Size;
    }
    else {
      pIVar2 = (this->_Path).Data;
    }
    (this->_Path).Size = iVar1 + 1;
    pIVar2[iVar1] = *a;
    iVar1 = (this->_Path).Size;
    if (iVar1 == (this->_Path).Capacity) {
      if (iVar1 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar1 / 2 + iVar1;
      }
      iVar5 = iVar1 + 1;
      if (iVar1 + 1 < iVar3) {
        iVar5 = iVar3;
      }
      pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 == (ImVec2 *)0x0) {
        pIVar4 = (ImVec2 *)0x0;
      }
      else {
        memcpy(pIVar2,pIVar4,(long)(this->_Path).Size << 3);
        pIVar4 = (this->_Path).Data;
      }
      ImGui::MemFree(pIVar4);
      (this->_Path).Data = pIVar2;
      (this->_Path).Capacity = iVar5;
      iVar1 = (this->_Path).Size;
    }
    else {
      pIVar2 = (this->_Path).Data;
    }
    (this->_Path).Size = iVar1 + 1;
    pIVar2[iVar1] = *b;
    iVar1 = (this->_Path).Size;
    if (iVar1 == (this->_Path).Capacity) {
      if (iVar1 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar1 / 2 + iVar1;
      }
      iVar5 = iVar1 + 1;
      if (iVar1 + 1 < iVar3) {
        iVar5 = iVar3;
      }
      pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 == (ImVec2 *)0x0) {
        pIVar4 = (ImVec2 *)0x0;
      }
      else {
        memcpy(pIVar2,pIVar4,(long)(this->_Path).Size << 3);
        pIVar4 = (this->_Path).Data;
      }
      ImGui::MemFree(pIVar4);
      (this->_Path).Data = pIVar2;
      (this->_Path).Capacity = iVar5;
      iVar1 = (this->_Path).Size;
    }
    else {
      pIVar2 = (this->_Path).Data;
    }
    (this->_Path).Size = iVar1 + 1;
    pIVar2[iVar1] = *c;
    AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col,true);
    if ((this->_Path).Capacity < 0) {
      pIVar4 = (ImVec2 *)0x0;
      __dest = (ImVec2 *)ImGui::MemAlloc(0);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(__dest,pIVar2,(long)(this->_Path).Size << 3);
        pIVar4 = (this->_Path).Data;
      }
      ImGui::MemFree(pIVar4);
      (this->_Path).Data = __dest;
      (this->_Path).Capacity = 0;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddTriangleFilled(const ImVec2& a, const ImVec2& b, const ImVec2& c, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathFillConvex(col);
}